

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
::destruct_value(storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *this)

{
  if (*(storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> **)(this + 0x20) !=
      this + 0x30) {
    operator_delete(*(storage_t<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> **)
                     (this + 0x20),*(long *)(this + 0x30) + 1);
  }
  if (*(long *)(this + 0x18) != 0) {
    (**(code **)(*(long *)(this + 0x18) + 0x20))(this + 8);
    *(undefined8 *)(this + 0x18) = 0;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }